

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

void * flatcc_emitter_copy_buffer(flatcc_emitter_t *E,void *buf,size_t size)

{
  size_t __n;
  size_t len;
  flatcc_emitter_page_t *p;
  size_t size_local;
  void *buf_local;
  flatcc_emitter_t *E_local;
  
  if (size < E->used) {
    E_local = (flatcc_emitter_t *)0x0;
  }
  else if (E->front == (flatcc_emitter_page_t *)0x0) {
    E_local = (flatcc_emitter_t *)0x0;
  }
  else if (E->front == E->back) {
    memcpy(buf,E->front_cursor,E->used);
    E_local = (flatcc_emitter_t *)buf;
  }
  else {
    __n = 0xb80 - E->front_left;
    memcpy(buf,E->front_cursor,__n);
    size_local = (long)buf + __n;
    for (len = (size_t)E->front->next; (flatcc_emitter_page_t *)len != E->back;
        len = *(size_t *)(len + 0xb80)) {
      memcpy((void *)size_local,(void *)len,0xb80);
      size_local = size_local + 0xb80;
    }
    memcpy((void *)size_local,(void *)len,0xb80 - E->back_left);
    E_local = (flatcc_emitter_t *)size_local;
  }
  return E_local;
}

Assistant:

void *flatcc_emitter_copy_buffer(flatcc_emitter_t *E, void *buf, size_t size)
{
    flatcc_emitter_page_t *p;
    size_t len;

    if (size < E->used) {
        return 0;
    }
    if (!E->front) {
        return 0;
    }
    if (E->front == E->back) {
        memcpy(buf, E->front_cursor, E->used);
        return buf;
    }
    len = FLATCC_EMITTER_PAGE_SIZE - E->front_left;
    memcpy(buf, E->front_cursor, len);
    buf = (uint8_t *)buf + len;
    p = E->front->next;
    while (p != E->back) {
        memcpy(buf, p->page, FLATCC_EMITTER_PAGE_SIZE);
        buf = (uint8_t *)buf + FLATCC_EMITTER_PAGE_SIZE;
        p = p->next;
    }
    memcpy(buf, p->page, FLATCC_EMITTER_PAGE_SIZE - E->back_left);
    return buf;
}